

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubD::ClearComponentMarkBits
          (ON_SubD *this,bool bClearVertexMarkBits,bool bClearEdgeMarkBits,bool bClearFaceMarkBits)

{
  ON__UINT8 OVar1;
  ON_SubDFace *local_e8;
  ON_SubDFace *f;
  ON_SubDFaceIterator fit;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  ON_SubDVertex *local_58;
  ON_SubDVertex *v;
  ON_SubDVertexIterator vit;
  uint clear_count;
  bool bClearFaceMarkBits_local;
  bool bClearEdgeMarkBits_local;
  bool bClearVertexMarkBits_local;
  ON_SubD *this_local;
  
  vit.m_component_ptr.m_ptr._0_4_ = 0;
  vit.m_component_ptr.m_ptr._5_1_ = bClearFaceMarkBits;
  vit.m_component_ptr.m_ptr._6_1_ = bClearEdgeMarkBits;
  vit.m_component_ptr.m_ptr._7_1_ = bClearVertexMarkBits;
  if (bClearVertexMarkBits) {
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&v,this);
    local_58 = ON_SubDVertexIterator::FirstVertex((ON_SubDVertexIterator *)&v);
    while (local_58 != (ON_SubDVertex *)0x0) {
      OVar1 = ON_ComponentStatus::MarkBits(&(local_58->super_ON_SubDComponentBase).m_status);
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits(&(local_58->super_ON_SubDComponentBase).m_status,'\0');
        vit.m_component_ptr.m_ptr._0_4_ = (uint)vit.m_component_ptr.m_ptr + 1;
      }
      local_58 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&v);
    }
    ON_SubDVertexIterator::~ON_SubDVertexIterator((ON_SubDVertexIterator *)&v);
  }
  if ((vit.m_component_ptr.m_ptr._6_1_ & 1) != 0) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e,this);
    fit.m_component_ptr.m_ptr =
         (ON__UINT_PTR)ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
    while (fit.m_component_ptr.m_ptr != 0) {
      OVar1 = ON_ComponentStatus::MarkBits((ON_ComponentStatus *)(fit.m_component_ptr.m_ptr + 0x10))
      ;
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits
                  ((ON_ComponentStatus *)(fit.m_component_ptr.m_ptr + 0x10),'\0');
        vit.m_component_ptr.m_ptr._0_4_ = (uint)vit.m_component_ptr.m_ptr + 1;
      }
      fit.m_component_ptr.m_ptr =
           (ON__UINT_PTR)ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
    }
    ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
  }
  if ((vit.m_component_ptr.m_ptr._5_1_ & 1) != 0) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&f,this);
    local_e8 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&f);
    while (local_e8 != (ON_SubDFace *)0x0) {
      OVar1 = ON_ComponentStatus::MarkBits(&(local_e8->super_ON_SubDComponentBase).m_status);
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits(&(local_e8->super_ON_SubDComponentBase).m_status,'\0');
        vit.m_component_ptr.m_ptr._0_4_ = (uint)vit.m_component_ptr.m_ptr + 1;
      }
      local_e8 = ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&f);
    }
    ON_SubDFaceIterator::~ON_SubDFaceIterator((ON_SubDFaceIterator *)&f);
  }
  return (uint)vit.m_component_ptr.m_ptr;
}

Assistant:

unsigned int ON_SubD::ClearComponentMarkBits(
  bool bClearVertexMarkBits,
  bool bClearEdgeMarkBits,
  bool bClearFaceMarkBits
) const
{
  unsigned int clear_count = 0;

  if (bClearVertexMarkBits)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (0 != v->m_status.MarkBits())
      {
        v->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  if (bClearEdgeMarkBits)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (0 != e->m_status.MarkBits())
      {
        e->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  if (bClearFaceMarkBits)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (0 != f->m_status.MarkBits())
      {
        f->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  return clear_count;
}